

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::Texture1D::updateView(Texture1D *this,DepthStencilMode mode)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ConstPixelBufferAccess *pCVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar5 = (this->super_Texture).m_baseLevel;
  uVar6 = (ulong)uVar5;
  if ((uVar6 < 0xe) && ((this->m_levels).m_data[uVar6].m_cap != 0)) {
    bVar2 = isEmpty(&(this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess);
    if (!bVar2) {
      if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
        iVar7 = 1;
      }
      else {
        uVar1 = (this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[0];
        iVar3 = ((this->super_Texture).m_maxLevel - uVar5) + 1;
        uVar5 = 0x20;
        if (uVar1 != 0) {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        iVar7 = 0x20 - uVar5;
        if (iVar3 < (int)(0x20 - uVar5)) {
          iVar7 = iVar3;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      pCVar4 = (this->m_levels).m_effectiveAccess + uVar6;
      goto LAB_015268e2;
    }
  }
  iVar7 = 0;
  pCVar4 = (ConstPixelBufferAccess *)0x0;
LAB_015268e2:
  (this->m_view).m_numLevels = iVar7;
  (this->m_view).m_levels = pCVar4;
  return;
}

Assistant:

void Texture1D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels1D(width)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture2DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture2DView(0, DE_NULL);
}